

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteStates::GetStateIndexByName(MADPComponentDiscreteStates *this,string *s)

{
  bool bVar1;
  __type_conflict _Var2;
  undefined8 uVar3;
  reference pSVar4;
  ostream *poVar5;
  E *this_00;
  stringstream *arg;
  string *in_RSI;
  char *in_RDI;
  stringstream ss;
  string s2;
  const_iterator last;
  const_iterator it;
  NamedDescribedEntity *in_stack_fffffffffffffdd8;
  __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
  *in_stack_fffffffffffffde0;
  __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
  *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf8;
  Index in_stack_fffffffffffffdfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  E *in_stack_fffffffffffffe10;
  ostream local_1e0 [376];
  StateDiscrete *local_68;
  uint local_5c;
  string local_58 [32];
  StateDiscrete *local_38;
  __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
  local_30 [3];
  string *local_18;
  Index local_4;
  
  if ((in_RDI[8] & 1U) == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffe10,in_RDI);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_18 = in_RSI;
  local_30[0]._M_current =
       (StateDiscrete *)
       std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::begin
                 ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)in_stack_fffffffffffffdd8
                 );
  local_38 = (StateDiscrete *)
             std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::end
                       ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)
                        in_stack_fffffffffffffdd8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffde0,
                       (__normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe10);
      poVar5 = std::operator<<(local_1e0,"GetStateIndexByName - state \"");
      poVar5 = std::operator<<(poVar5,local_18);
      this_00 = (E *)std::operator<<(poVar5,"\" not found.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      arg = (stringstream *)__cxa_allocate_exception(0x28);
      E::E(this_00,arg);
      __cxa_throw(arg,&E::typeinfo,E::~E);
    }
    __gnu_cxx::
    __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
    ::operator*(local_30);
    NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffdd8);
    _Var2 = std::operator==(in_stack_fffffffffffffe00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (_Var2) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
               ::operator*(local_30);
      in_stack_fffffffffffffdfc = DiscreteEntity::GetIndex(&pSVar4->super_DiscreteEntity);
      local_4 = in_stack_fffffffffffffdfc;
    }
    else {
      local_68 = (StateDiscrete *)
                 __gnu_cxx::
                 __normal_iterator<const_StateDiscrete_*,_std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>_>
                 ::operator++(in_stack_fffffffffffffde8,
                              (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    }
    local_5c = (uint)_Var2;
    std::__cxx11::string::~string(local_58);
  } while (local_5c == 0);
  return local_4;
}

Assistant:

Index MADPComponentDiscreteStates::GetStateIndexByName(const string &s) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteStates::GetStateIndexByName - not initialized!");

    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetStateIndexByName - state \"" << s << "\" not found." << endl;
    throw E(ss);

}